

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

Bdc_Man_t * Bdc_ManAlloc(Bdc_Par_t *pPars)

{
  int iVar1;
  Bdc_Man_t *p_00;
  Bdc_Fun_t *pBVar2;
  Vec_Int_t *pVVar3;
  Bdc_Fun_t **ppBVar4;
  Vec_Ptr_t *pVVar5;
  uint *puVar6;
  Bdc_Man_t *p;
  Bdc_Par_t *pPars_local;
  
  p_00 = (Bdc_Man_t *)malloc(0x148);
  memset(p_00,0,0x148);
  if ((1 < pPars->nVarsMax) && (pPars->nVarsMax < 0x10)) {
    p_00->pPars = pPars;
    iVar1 = Kit_TruthWordNum(pPars->nVarsMax);
    p_00->nWords = iVar1;
    p_00->nDivsLimit = 200;
    p_00->nNodesAlloc = 0x200;
    pBVar2 = (Bdc_Fun_t *)malloc((long)p_00->nNodesAlloc * 0x38);
    p_00->pNodes = pBVar2;
    pVVar3 = Vec_IntStart(p_00->nWords * 8 * p_00->nNodesAlloc);
    p_00->vMemory = pVVar3;
    Vec_IntClear(p_00->vMemory);
    p_00->nTableSize = 1 << ((byte)p_00->pPars->nVarsMax & 0x1f);
    ppBVar4 = (Bdc_Fun_t **)malloc((long)p_00->nTableSize << 3);
    p_00->pTable = ppBVar4;
    memset(p_00->pTable,0,(long)p_00->nTableSize << 3);
    pVVar3 = Vec_IntAlloc(0x100);
    p_00->vSpots = pVVar3;
    pVVar5 = Vec_PtrAllocTruthTables(p_00->pPars->nVarsMax);
    p_00->vTruths = pVVar5;
    puVar6 = (uint *)malloc((long)(p_00->nWords << 2) << 2);
    p_00->puTemp1 = puVar6;
    p_00->puTemp2 = p_00->puTemp1 + p_00->nWords;
    p_00->puTemp3 = p_00->puTemp2 + p_00->nWords;
    p_00->puTemp4 = p_00->puTemp3 + p_00->nWords;
    p_00->pIsfOL = &p_00->IsfOL;
    Bdc_IsfStart(p_00,p_00->pIsfOL);
    p_00->pIsfOR = &p_00->IsfOR;
    Bdc_IsfStart(p_00,p_00->pIsfOR);
    p_00->pIsfAL = &p_00->IsfAL;
    Bdc_IsfStart(p_00,p_00->pIsfAL);
    p_00->pIsfAR = &p_00->IsfAR;
    Bdc_IsfStart(p_00,p_00->pIsfAR);
    return p_00;
  }
  __assert_fail("pPars->nVarsMax > 1 && pPars->nVarsMax < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                ,0x49,"Bdc_Man_t *Bdc_ManAlloc(Bdc_Par_t *)");
}

Assistant:

Bdc_Man_t * Bdc_ManAlloc( Bdc_Par_t * pPars )
{
    Bdc_Man_t * p;
    p = ABC_ALLOC( Bdc_Man_t, 1 );
    memset( p, 0, sizeof(Bdc_Man_t) );
    assert( pPars->nVarsMax > 1 && pPars->nVarsMax < 16 );
    p->pPars = pPars;
    p->nWords = Kit_TruthWordNum( pPars->nVarsMax );
    p->nDivsLimit = 200;
    // internal nodes
    p->nNodesAlloc = 512;
    p->pNodes = ABC_ALLOC( Bdc_Fun_t, p->nNodesAlloc );
    // memory
    p->vMemory = Vec_IntStart( 8 * p->nWords * p->nNodesAlloc );
    Vec_IntClear(p->vMemory);
    // set up hash table
    p->nTableSize = (1 << p->pPars->nVarsMax);
    p->pTable = ABC_ALLOC( Bdc_Fun_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Bdc_Fun_t *) * p->nTableSize );
    p->vSpots = Vec_IntAlloc( 256 );
    // truth tables
    p->vTruths = Vec_PtrAllocTruthTables( p->pPars->nVarsMax );
    p->puTemp1 = ABC_ALLOC( unsigned, 4 * p->nWords );
    p->puTemp2 = p->puTemp1 + p->nWords;
    p->puTemp3 = p->puTemp2 + p->nWords;
    p->puTemp4 = p->puTemp3 + p->nWords;
    // start the internal ISFs
    p->pIsfOL = &p->IsfOL;  Bdc_IsfStart( p, p->pIsfOL );
    p->pIsfOR = &p->IsfOR;  Bdc_IsfStart( p, p->pIsfOR );
    p->pIsfAL = &p->IsfAL;  Bdc_IsfStart( p, p->pIsfAL );
    p->pIsfAR = &p->IsfAR;  Bdc_IsfStart( p, p->pIsfAR );   
    return p; 
}